

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O0

uint SOIL_load_OGL_texture(char *filename,int force_channels,uint reuse_texture_ID,uint flags)

{
  uint uVar1;
  uint local_3c;
  uint tex_id;
  int channels;
  int height;
  int width;
  uchar *img;
  uint local_20;
  uint flags_local;
  uint reuse_texture_ID_local;
  int force_channels_local;
  char *filename_local;
  
  img._4_4_ = flags;
  local_20 = reuse_texture_ID;
  flags_local = force_channels;
  _reuse_texture_ID_local = filename;
  if (((flags & 0x40) == 0) ||
     (filename_local._4_4_ = SOIL_direct_load_DDS(filename,reuse_texture_ID,flags,0),
     filename_local._4_4_ == 0)) {
    _height = SOIL_load_image(_reuse_texture_ID_local,&channels,(int *)&tex_id,(int *)&local_3c,
                              flags_local);
    if ((0 < (int)flags_local) && ((int)flags_local < 5)) {
      local_3c = flags_local;
    }
    if (_height == (uchar *)0x0) {
      result_string_pointer = stbi_failure_reason();
      filename_local._4_4_ = 0;
    }
    else {
      uVar1 = SOIL_internal_create_OGL_texture
                        (_height,channels,tex_id,local_3c,local_20,img._4_4_,0xde1,0xde1,0xd33);
      SOIL_free_image_data(_height);
      filename_local._4_4_ = uVar1;
    }
  }
  return filename_local._4_4_;
}

Assistant:

unsigned int
	SOIL_load_OGL_texture
	(
		const char *filename,
		int force_channels,
		unsigned int reuse_texture_ID,
		unsigned int flags
	)
{
	/*	variables	*/
	unsigned char* img;
	int width, height, channels;
	unsigned int tex_id;
	/*	does the user want direct uploading of the image as a DDS file?	*/
	if( flags & SOIL_FLAG_DDS_LOAD_DIRECT )
	{
		/*	1st try direct loading of the image as a DDS file
			note: direct uploading will only load what is in the
			DDS file, no MIPmaps will be generated, the image will
			not be flipped, etc.	*/
		tex_id = SOIL_direct_load_DDS( filename, reuse_texture_ID, flags, 0 );
		if( tex_id )
		{
			/*	hey, it worked!!	*/
			return tex_id;
		}
	}
	/*	try to load the image	*/
	img = SOIL_load_image( filename, &width, &height, &channels, force_channels );
	/*	channels holds the original number of channels, which may have been forced	*/
	if( (force_channels >= 1) && (force_channels <= 4) )
	{
		channels = force_channels;
	}
	if( NULL == img )
	{
		/*	image loading failed	*/
		result_string_pointer = stbi_failure_reason();
		return 0;
	}
	/*	OK, make it a texture!	*/
	tex_id = SOIL_internal_create_OGL_texture(
			img, width, height, channels,
			reuse_texture_ID, flags,
			GL_TEXTURE_2D, GL_TEXTURE_2D,
			GL_MAX_TEXTURE_SIZE );
	/*	and nuke the image data	*/
	SOIL_free_image_data( img );
	/*	and return the handle, such as it is	*/
	return tex_id;
}